

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_garbage_perm.c
# Opt level: O2

void __thiscall lu_garbage_perm(void *this)

{
  int iVar1;
  int iVar2;
  void *__dest;
  void *__dest_00;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  iVar1 = *(int *)((long)this + 0x54);
  uVar4 = (ulong)*(uint *)((long)this + 400);
  if (iVar1 < (int)*(uint *)((long)this + 400)) {
    __dest = *(void **)((long)this + 0x1d8);
    __dest_00 = *(void **)((long)this + 0x1e8);
    lVar3 = *(long *)((long)this + 0x290);
    iVar5 = *(int *)((long)this + 0x18c) + 1;
    *(int *)((long)this + 0x18c) = iVar5;
    uVar6 = uVar4;
    while( true ) {
      lVar7 = (long)(int)uVar4;
      if ((int)uVar6 < 1) break;
      iVar2 = *(int *)((long)__dest + uVar6 * 4 + -4);
      uVar6 = uVar6 - 1;
      if (*(int *)(lVar3 + (long)iVar2 * 4) != iVar5) {
        *(int *)(lVar3 + (long)iVar2 * 4) = iVar5;
        uVar4 = (ulong)((int)uVar4 - 1);
        *(int *)((long)__dest + lVar7 * 4 + -4) = iVar2;
        *(undefined4 *)((long)__dest_00 + lVar7 * 4 + -4) =
             *(undefined4 *)((long)__dest_00 + uVar6 * 4);
      }
    }
    memmove(__dest,(void *)((long)__dest + lVar7 * 4),(long)iVar1 << 2);
    memmove(__dest_00,(void *)((long)__dest_00 + lVar7 * 4),(long)iVar1 << 2);
    *(int *)((long)this + 400) = iVar1;
  }
  return;
}

Assistant:

void lu_garbage_perm(struct lu *this)
{
    const lu_int m      = this->m;
    lu_int pivotlen     = this->pivotlen;
    lu_int *pivotcol    = this->pivotcol;
    lu_int *pivotrow    = this->pivotrow;
    lu_int *marked      = this->marked;

    lu_int j, get, put, marker;

    if (pivotlen > m)
    {
        marker = ++this->marker;
        put = pivotlen;
        for (get = pivotlen-1; get >= 0; get--)
        {
            if (marked[j = pivotcol[get]] != marker)
            {
                marked[j] = marker;
                pivotcol[--put] = j;
                pivotrow[put] = pivotrow[get];
            }
        }
        assert(put+m == pivotlen);
        memmove(pivotcol, pivotcol+put, m*sizeof(lu_int));
        memmove(pivotrow, pivotrow+put, m*sizeof(lu_int));
        this->pivotlen = m;
    }
}